

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_audio.c
# Opt level: O3

void ws_audio_port_write(void *info,UINT8 port,UINT8 value)

{
  short sVar1;
  ushort uVar2;
  ulong uVar3;
  undefined7 in_register_00000031;
  float fVar4;
  
  uVar3 = CONCAT71(in_register_00000031,port) & 0xffffffff;
  *(UINT8 *)((long)info + uVar3 + 0x6c) = value;
  switch((int)CONCAT71(in_register_00000031,port)) {
  case 0x80:
  case 0x81:
    fVar4 = 0.0;
    if (*(ushort *)((long)info + 0xec) != 0xffff) {
      fVar4 = 1.0 / (float)(int)(0x800 - (*(ushort *)((long)info + 0xec) & 0x7ff));
    }
    *(int *)((long)info + 0x10) = (int)(long)(fVar4 * *(float *)((long)info + 0x180));
    return;
  case 0x82:
  case 0x83:
    fVar4 = 0.0;
    if (*(ushort *)((long)info + 0xee) != 0xffff) {
      fVar4 = 1.0 / (float)(int)(0x800 - (*(ushort *)((long)info + 0xee) & 0x7ff));
    }
    *(int *)((long)info + 0x20) = (int)(long)(fVar4 * *(float *)((long)info + 0x180));
    return;
  case 0x84:
  case 0x85:
    uVar2 = *(ushort *)((long)info + 0xf0);
    *(ushort *)((long)info + 0x5e) = uVar2;
    if (uVar2 == 0xffff) {
      fVar4 = 0.0;
    }
    else {
      fVar4 = 1.0 / (float)(int)(0x800 - (uVar2 & 0x7ff));
    }
    *(int *)((long)info + 0x30) = (int)(long)(fVar4 * *(float *)((long)info + 0x180));
    return;
  case 0x86:
  case 0x87:
    fVar4 = 0.0;
    if (*(ushort *)((long)info + 0xf2) != 0xffff) {
      fVar4 = 1.0 / (float)(int)(0x800 - (*(ushort *)((long)info + 0xf2) & 0x7ff));
    }
    *(int *)((long)info + 0x40) = (int)(long)(fVar4 * *(float *)((long)info + 0x180));
    return;
  case 0x88:
    *(UINT8 *)((long)info + 10) = value >> 4;
    *(byte *)((long)info + 0xb) = value & 0xf;
    return;
  case 0x89:
    *(UINT8 *)((long)info + 0x1a) = value >> 4;
    *(byte *)((long)info + 0x1b) = value & 0xf;
    return;
  case 0x8a:
    *(UINT8 *)((long)info + 0x2a) = value >> 4;
    *(byte *)((long)info + 0x2b) = value & 0xf;
    return;
  case 0x8b:
    *(UINT8 *)((long)info + 0x3a) = value >> 4;
    *(byte *)((long)info + 0x3b) = value & 0xf;
    return;
  case 0x8c:
    *(UINT8 *)((long)info + 0x5a) = value;
    return;
  case 0x8d:
    sVar1 = (ushort)value * 0x20 + 0x20;
    *(short *)((long)info + 0x58) = sVar1;
    *(short *)((long)info + 0x5c) = sVar1;
    return;
  case 0x8e:
    *(byte *)((long)info + 0x60) = value & 7;
    if ((value & 8) != 0) {
      *(undefined4 *)((long)info + 100) = 1;
      return;
    }
    break;
  case 0x8f:
    uVar2 = (ushort)value * 0x40;
    *(ushort *)((long)info + 8) = uVar2;
    *(ushort *)((long)info + 0x18) = uVar2 + 0x10;
    *(ushort *)((long)info + 0x28) = uVar2 + 0x20;
    *(ushort *)((long)info + 0x38) = uVar2 | 0x30;
    return;
  case 0x91:
    *(byte *)((long)info + uVar3 + 0x6c) = value | 0x80;
    return;
  case 0x94:
    *(byte *)((long)info + 0x6a) = value * '\x02' & 0x18;
    *(byte *)((long)info + 0x6b) = (value & 3) << 3;
  }
  return;
}

Assistant:

static void ws_audio_port_write(void* info, UINT8 port, UINT8 value)
{
	wsa_state* chip = (wsa_state*)info;
	UINT16 i;
	float freq;

	chip->ws_ioRam[port]=value;

	switch (port)
	{
	// 0x80-0x87の周波数レジスタについて
	// - ロックマン&フォルテの0x0fの曲では、周波数=0xFFFF の音が不要
	// - デジモンディープロジェクトの0x0dの曲のノイズは 周波数=0x07FF で音を出す
	// →つまり、0xFFFF の時だけ音を出さないってことだろうか。
	//   でも、0x07FF の時も音を出さないけど、ノイズだけ音を出すのかも。
	case 0x80:
	case 0x81:	i=(((UINT16)chip->ws_ioRam[0x81])<<8)+((UINT16)chip->ws_ioRam[0x80]);
				if (i == 0xffff)
					freq = 0;
				else
					freq = 1.0f/(2048-(i&0x7ff));
				chip->ws_audio[0].delta = (UINT32)(freq * chip->ratemul);
				break;
	case 0x82:
	case 0x83:	i=(((UINT16)chip->ws_ioRam[0x83])<<8)+((UINT16)chip->ws_ioRam[0x82]);
				if (i == 0xffff)
					freq = 0;
				else
					freq = 1.0f/(2048-(i&0x7ff));
				chip->ws_audio[1].delta = (UINT32)(freq * chip->ratemul);
				break;
	case 0x84:
	case 0x85:	i=(((UINT16)chip->ws_ioRam[0x85])<<8)+((UINT16)chip->ws_ioRam[0x84]);
				chip->SweepFreq = i;
				if (i == 0xffff)
					freq = 0;
				else
					freq = 1.0f/(2048-(i&0x7ff));
				chip->ws_audio[2].delta = (UINT32)(freq * chip->ratemul);
				break;
	case 0x86:
	case 0x87:	i=(((UINT16)chip->ws_ioRam[0x87])<<8)+((UINT16)chip->ws_ioRam[0x86]);
				if (i == 0xffff)
					freq = 0;
				else
					freq = 1.0f/(2048-(i&0x7ff));
				chip->ws_audio[3].delta = (UINT32)(freq * chip->ratemul);
				break;
	case 0x88:
				chip->ws_audio[0].lvol = (value>>4)&0xf;
				chip->ws_audio[0].rvol = value&0xf;
				break;
	case 0x89:
				chip->ws_audio[1].lvol = (value>>4)&0xf;
				chip->ws_audio[1].rvol = value&0xf;
				break;
	case 0x8A:
				chip->ws_audio[2].lvol = (value>>4)&0xf;
				chip->ws_audio[2].rvol = value&0xf;
				break;
	case 0x8B:
				chip->ws_audio[3].lvol = (value>>4)&0xf;
				chip->ws_audio[3].rvol = value&0xf;
				break;
	case 0x8C:
				chip->SweepStep = (INT8)value;
				break;
	case 0x8D:
				//Sweepの間隔は 1/375[s] = 2.666..[ms]
				//CPU Clockで言うと 3072000/375 = 8192[cycles]
				//ここの設定値をnとすると、8192[cycles]*(n+1) 間隔でSweepすることになる
				//
				//これを HBlank (256cycles) の間隔で言うと、
				//　8192/256 = 32
				//なので、32[HBlank]*(n+1) 間隔となる
				chip->SweepTime = (((INT16)value)+1)<<5;
				chip->SweepCount = chip->SweepTime;
				break;
	case 0x8E:
				chip->NoiseType = value&7;
				if (value&8) chip->NoiseRng = 1;	//ノイズカウンターリセット
				break;
	case 0x8F:
				chip->ws_audio[0].wave = (UINT16)value<<6;
				chip->ws_audio[1].wave = chip->ws_audio[0].wave + 0x10;
				chip->ws_audio[2].wave = chip->ws_audio[1].wave + 0x10;
				chip->ws_audio[3].wave = chip->ws_audio[2].wave + 0x10;
				break;
	case 0x90:
				break;
	case 0x91:
				//ここでのボリューム調整は、内蔵Speakerに対しての調整だけらしいので、
				//ヘッドフォン接続されていると認識させれば問題無いらしい。
				chip->ws_ioRam[port] |= 0x80;
				break;
	case 0x92:
	case 0x93:
				break;
	case 0x94:
				chip->PCMVolumeLeft  = (value&0xc)*2;
				chip->PCMVolumeRight = ((value<<2)&0xc)*2;
				break;
	case 0x52:
				//if (value&0x80)
				//	ws_timer_set(2, DMACycles[value&3]);
				break;
	}
}